

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invent.c
# Opt level: O3

int count_unpaid(obj *list)

{
  int iVar1;
  int iVar2;
  
  if (list == (obj *)0x0) {
    iVar2 = 0;
  }
  else {
    iVar2 = 0;
    do {
      iVar2 = iVar2 + (uint)((*(uint *)&list->field_0x4a >> 2 & 1) != 0);
      if (list->cobj != (obj *)0x0) {
        iVar1 = count_unpaid(list->cobj);
        iVar2 = iVar2 + iVar1;
      }
      list = list->nobj;
    } while (list != (obj *)0x0);
  }
  return iVar2;
}

Assistant:

int count_unpaid(struct obj *list)
{
    int count = 0;

    while (list) {
	if (list->unpaid) count++;
	if (Has_contents(list))
	    count += count_unpaid(list->cobj);
	list = list->nobj;
    }
    return count;
}